

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseAST.cpp
# Opt level: O0

string * __thiscall antlr::BaseAST::toStringTree_abi_cxx11_(BaseAST *this)

{
  AST *pAVar1;
  ASTRefCount<antlr::AST> *in_RSI;
  string *in_RDI;
  string *ts;
  string local_98 [8];
  allocator<char> *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  ASTRefCount<antlr::AST> local_78;
  string local_70 [32];
  string local_50 [32];
  ASTRefCount local_30 [30];
  allocator<char> local_12;
  undefined1 local_11;
  
  local_11 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  std::allocator<char>::~allocator(&local_12);
  (**(code **)&in_RSI->ref[6].count)(local_30);
  pAVar1 = ASTRefCount::operator_cast_to_AST_(local_30);
  ASTRefCount<antlr::AST>::~ASTRefCount(in_RSI);
  if (pAVar1 == (AST *)0x0) {
    std::__cxx11::string::operator+=((string *)in_RDI," ");
    (*(code *)in_RSI->ref[0xc].ptr)(local_98);
    std::__cxx11::string::operator+=((string *)in_RDI,local_98);
    std::__cxx11::string::~string(local_98);
  }
  else {
    std::__cxx11::string::operator+=((string *)in_RDI," ( ");
    (*(code *)in_RSI->ref[0xc].ptr)(local_50);
    std::__cxx11::string::operator+=((string *)in_RDI,local_50);
    std::__cxx11::string::~string(local_50);
    (**(code **)&in_RSI->ref[6].count)(&local_78);
    pAVar1 = ASTRefCount<antlr::AST>::operator->(&local_78);
    (*pAVar1->_vptr_AST[0x19])(local_70);
    std::__cxx11::string::operator+=((string *)in_RDI,local_70);
    std::__cxx11::string::~string(local_70);
    ASTRefCount<antlr::AST>::~ASTRefCount(in_RSI);
    std::__cxx11::string::operator+=((string *)in_RDI," )");
  }
  return in_RDI;
}

Assistant:

string BaseAST::toStringTree() const
{
	ANTLR_USE_NAMESPACE(std)string ts = "";

	if (getFirstChild())
	{
		ts+=" ( ";
		ts+=toString();
		ts+=getFirstChild()->toStringList();
		ts+=" )";
	}
	else
	{
		ts+=" ";
		ts+=toString();
	}
	return ts;
}